

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O2

void __thiscall
tf::Executor::_tear_down_invoke(Executor *this,Worker *worker,Node *node,Node **cache)

{
  atomic<unsigned_long> *paVar1;
  uint uVar2;
  Node *pNVar3;
  
  pNVar3 = node->_parent;
  if (pNVar3 == (Node *)0x0) {
    LOCK();
    paVar1 = &node->_topology->_join_counter;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
    UNLOCK();
    if ((paVar1->super___atomic_base<unsigned_long>)._M_i == 0) {
      _tear_down_topology(this,worker,node->_topology);
      return;
    }
  }
  else {
    uVar2 = pNVar3->_nstate;
    LOCK();
    paVar1 = &pNVar3->_join_counter;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
    UNLOCK();
    if (((paVar1->super___atomic_base<unsigned_long>)._M_i == 0) && ((uVar2 & 0x20000000) != 0)) {
      if (*cache != (Node *)0x0) {
        _schedule(this,worker,*cache);
      }
      *cache = pNVar3;
    }
  }
  return;
}

Assistant:

inline void Executor::_tear_down_invoke(Worker& worker, Node* node, Node*& cache) {
  
  // we must check parent first before subtracting the join counter,
  // or it can introduce data race
  if(auto parent = node->_parent; parent == nullptr) {
    if(node->_topology->_join_counter.fetch_sub(1, std::memory_order_acq_rel) == 1) {
      _tear_down_topology(worker, node->_topology);
    }
  }
  else {  
    // needs to fetch every data before join counter becomes zero at which
    // the node may be deleted
    auto state = parent->_nstate;
    if(parent->_join_counter.fetch_sub(1, std::memory_order_acq_rel) == 1) {
      if(state & NSTATE::PREEMPTED) {
        _update_cache(worker, cache, parent);
      }
    }
  }
}